

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneT.cpp
# Opt level: O2

void __thiscall
PermutazioneT::randomSS
          (PermutazioneT *this,PermutazioneT *p,unsigned_short *spostamenti,double F,Coppia *coppie)

{
  ushort uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *__s;
  void *pvVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  PermutazioneT *pPVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  uint local_80;
  uint local_7c;
  void *local_78;
  ulong local_70;
  PermutazioneT *local_68;
  ulong local_60;
  double local_58;
  int local_4c;
  ushort *local_48;
  void *local_40;
  Coppia *local_38;
  
  uVar1 = (p->super_Permutazione).dimensione;
  uVar15 = (ulong)uVar1;
  local_68 = p;
  local_58 = F;
  local_48 = spostamenti;
  local_38 = coppie;
  pvVar3 = operator_new__((ulong)((uint)uVar1 * 8));
  uVar13 = (ulong)((uint)uVar1 * 2);
  pvVar4 = operator_new__(uVar13);
  __s = operator_new__(uVar15);
  memset(__s,0,uVar15);
  memset(pvVar4,0,uVar13);
  uVar17 = extraout_RDX;
  for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
    pvVar5 = operator_new__(uVar13);
    *(void **)((long)pvVar3 + uVar12 * 8) = pvVar5;
    uVar17 = extraout_RDX_00;
  }
  uVar16 = 0;
  uVar13 = 0;
  uVar6 = 0;
  for (uVar12 = 0; local_80 = (uint)uVar12, uVar12 < uVar15; uVar12 = uVar12 + 1) {
    if (*(char *)((long)__s + uVar12) == '\0') {
      uVar15 = uVar13 & 0xffff;
      for (uVar17 = uVar12 & 0xffffffff; *(char *)((long)__s + uVar17) == '\0';
          uVar17 = (ulong)(local_68->super_Permutazione).individuo[uVar17]) {
        lVar8 = *(long *)((long)pvVar3 + uVar15 * 8);
        uVar1 = *(ushort *)((long)pvVar4 + uVar15 * 2);
        *(ushort *)((long)pvVar4 + uVar15 * 2) = uVar1 + 1;
        *(short *)(lVar8 + (ulong)uVar1 * 2) = (short)uVar17;
        *(undefined1 *)((long)__s + uVar17) = 1;
      }
      uVar6 = uVar6 + 1;
      uVar1 = *(ushort *)((long)pvVar4 + uVar15 * 2);
      if (uVar1 < 2) {
        *(undefined2 *)((long)pvVar4 + uVar15 * 2) = 0;
      }
      else {
        uVar16 = (ulong)((int)uVar16 + ((uVar1 - 1) * (uint)uVar1 >> 1));
        uVar13 = (ulong)((int)uVar13 + 1);
      }
    }
    uVar15 = (ulong)(local_68->super_Permutazione).dimensione;
  }
  local_7c = (uint)uVar17;
  dVar18 = ceil((double)(int)((int)uVar15 - (uVar6 & 0xffff)) * local_58);
  local_4c = (int)dVar18;
  *local_48 = 0;
  iVar2 = 0;
  local_78 = pvVar3;
  do {
    pvVar3 = local_78;
    if (((short)uVar13 == 0) || (local_4c <= iVar2)) {
      operator_delete__(__s);
      operator_delete__(pvVar4);
      pPVar10 = local_68;
      for (local_80 = 0; (int)local_80 < (int)(uint)(pPVar10->super_Permutazione).dimensione;
          local_80 = local_80 + 1) {
        pvVar4 = *(void **)((long)pvVar3 + (long)(int)local_80 * 8);
        if (pvVar4 != (void *)0x0) {
          operator_delete__(pvVar4);
          pPVar10 = local_68;
        }
      }
      operator_delete__(pvVar3);
      return;
    }
    local_58 = (double)CONCAT44(local_58._4_4_,iVar2);
    uVar13 = uVar13 & 0xffff;
    uVar17 = 0;
    local_60 = uVar16;
    iVar2 = Random::randIntU(&genRand,0,(int)uVar16 + -1);
    iVar14 = 0;
    while( true ) {
      iVar11 = (int)uVar13;
      uVar12 = uVar13;
      iVar9 = iVar11;
      if (uVar13 == uVar17) break;
      uVar1 = *(ushort *)((long)pvVar4 + uVar17 * 2);
      iVar14 = iVar14 + (int)((uVar1 - 1) * (uint)uVar1) / 2;
      if (iVar2 < iVar14) {
        uVar12 = uVar17;
        iVar9 = (int)uVar17;
        break;
      }
      uVar17 = uVar17 + 1;
    }
    local_70 = CONCAT44(local_70._4_4_,iVar9);
    uVar7 = (uint)*(ushort *)((long)pvVar4 + uVar12 * 2);
    Random::dueIndiciRandom(&genRand,uVar7,(int *)&local_80,(int *)&local_7c);
    uVar6 = local_80;
    pvVar3 = *(void **)((long)pvVar3 + uVar12 * 8);
    uVar1 = *local_48;
    local_38[uVar1].x = (uint)*(ushort *)((long)pvVar3 + (long)(int)local_80 * 2);
    local_38[uVar1].y = (uint)*(ushort *)((long)pvVar3 + (long)(int)local_7c * 2);
    *local_48 = uVar1 + 1;
    if ((int)local_7c < (int)local_80) {
      local_80 = local_7c;
      local_7c = uVar6;
    }
    uVar6 = (int)((uVar7 - 1) * uVar7) / -2 + (uint)local_60;
    iVar2 = (local_80 - local_7c) + uVar7;
    iVar14 = local_7c - local_80;
    lVar8 = (long)(int)local_80;
    if (iVar14 < 2 || iVar2 < 2) {
      if (iVar14 == 1 && 1 < iVar2) {
        if (0 < (int)(~local_7c + uVar7)) {
          memmove((void *)((long)pvVar3 + lVar8 * 2 + 2),
                  (void *)((long)pvVar3 + (long)(int)local_7c * 2 + 2),
                  (ulong)((~local_7c + uVar7) * 2));
        }
        *(short *)((long)pvVar4 + uVar12 * 2) = (short)iVar2;
        uVar7 = (iVar2 + -1) * iVar2;
        goto LAB_00106ef3;
      }
      if (1 < iVar14) {
        memmove(pvVar3,(void *)((long)pvVar3 + lVar8 * 2 + 2),(ulong)(uint)(iVar14 * 2));
        *(short *)((long)pvVar4 + uVar12 * 2) = (short)iVar14;
        uVar7 = (iVar14 + -1) * iVar14;
        goto LAB_00106ef3;
      }
      uVar13 = (ulong)(iVar11 - 1);
      uVar17 = uVar13 & 0xffff;
      if ((int)local_70 != (int)uVar17) {
        uVar1 = *(ushort *)((long)pvVar4 + uVar17 * 2);
        memcpy(pvVar3,*(void **)((long)local_78 + uVar17 * 8),(ulong)((uint)uVar1 * 2));
        *(ushort *)((long)pvVar4 + uVar12 * 2) = uVar1;
      }
    }
    else {
      local_60 = CONCAT44(local_60._4_4_,uVar6);
      local_70 = uVar13;
      local_40 = pvVar3;
      memcpy(*(void **)((long)local_78 + uVar13 * 8),(void *)((long)pvVar3 + lVar8 * 2 + 2),
             (ulong)(uint)(iVar14 * 2));
      *(short *)((long)pvVar4 + local_70 * 2) = (short)iVar14;
      iVar9 = ~local_7c + (uint)*(ushort *)((long)pvVar4 + uVar12 * 2);
      if (0 < iVar9) {
        memmove((void *)((long)local_40 + (long)(int)local_80 * 2 + 2),
                (void *)((long)local_40 + (long)(int)local_7c * 2 + 2),(ulong)(uint)(iVar9 * 2));
      }
      uVar13 = (ulong)(iVar11 + 1);
      *(short *)((long)pvVar4 + uVar12 * 2) = (short)iVar2;
      uVar7 = (iVar14 + -1) * iVar14 + (iVar2 + -1) * iVar2;
      uVar6 = (uint)local_60;
LAB_00106ef3:
      uVar6 = uVar6 + (uVar7 >> 1);
    }
    iVar2 = local_58._0_4_ + 1;
    uVar16 = (ulong)uVar6;
  } while( true );
}

Assistant:

void PermutazioneT::randomSS(PermutazioneT* p, unsigned short& spostamenti, double F, Coppia* coppie) {

	unsigned short** c = new unsigned short*[p->dimensione];
	unsigned short* lc = new unsigned short [p->dimensione];
	bool* v = new bool[p->dimensione];

	memset(v, 0, sizeof(bool) * p->dimensione);
	memset(lc, 0, sizeof(unsigned short) * p->dimensione);

	unsigned short nc1 = 0, nc = 0;

	int i, j, k, nit = 0, lim, r, nexc = 0, psum, t, lc1, lc2;

	for (i = 0; i < p->dimensione; i++) {
		c[i] = new unsigned short[p->dimensione];
	}

	for (i = 0; i < p->dimensione; i++) {
		if (v[i]) continue;
		j = i;
		while (!v[j]) {
			c[nc][lc[nc]++] = j;
			v[j] = true;
			j = p->individuo[j];
		}
		nc1++; 

		if (lc[nc] > 1) {
			nexc += lc[nc] * (lc[nc] - 1) / 2;
			nc++;
		}
		else
			lc[nc] = 0;
	}

	lim = ceil(F * (p->dimensione - nc1)); 

	spostamenti = 0;
	while (nc > 0 && nit < lim) {

		r = genRand.randIntU(0, nexc-1);
		psum = 0;
		for (k = 0; k < nc; k++) {
			psum += lc[k] * (lc[k] - 1) / 2;
			if (r < psum) break;
		}

		genRand.dueIndiciRandom(lc[k], i, j);

		coppie[spostamenti].x = c[k][i];
		coppie[spostamenti].y = c[k][j];
		spostamenti++;

		nexc -= lc[k] * (lc[k] - 1) / 2; 
		if (i > j) {
			t = i;
			i = j;
			j = t;
		}

		lc1 = i - j + lc[k];	
		lc2 = j - i;			

		if (lc1 > 1 && lc2 > 1) { 

			memcpy(c[nc], c[k] + (i + 1), sizeof(unsigned short) * lc2);
			lc[nc] = lc2;
			nc++;
			
			t = lc[k] - j - 1;	
			if (t > 0) memmove(c[k] + (i + 1), c[k] + (j + 1), sizeof(unsigned short) * t);
			lc[k] = lc1;

			nexc += (lc1 * (lc1 - 1) + lc2 * (lc2 - 1)) / 2;	
		}
		else if (lc1 > 1 && lc2 == 1) { 

			t = lc[k] - j - 1;	
			if (t > 0) memmove(c[k] + (i + 1), c[k] + (j + 1), sizeof(unsigned short) * t);
			lc[k] = lc1;
	
			nexc += lc1 * (lc1 - 1) / 2;
		}
		else if (lc2 > 1) { 

			memmove(c[k], c[k] + (i + 1), sizeof(unsigned short) * lc2);
			lc[k] = lc2;
		
			nexc += lc2 * (lc2 - 1) / 2;	
		}
		else { 

			nc--;
			if (k != nc) {
				memcpy(c[k], c[nc], sizeof(unsigned short) * lc[nc]);
				lc[k] = lc[nc];
			}
			
		}

		nit++;
	}
	delete[] v;
	delete[] lc;

	for (i = 0; i < p->dimensione; i++) {
		delete[] c[i];
	}
	delete[] c;
}